

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O0

void __thiscall QAction::setIconVisibleInMenu(QAction *this,bool visible)

{
  short sVar1;
  bool bVar2;
  byte bVar3;
  QActionPrivate *this_00;
  byte in_SIL;
  int oldValue;
  QActionPrivate *d;
  
  bVar2 = (bool)(in_SIL & 1);
  this_00 = d_func((QAction *)0x9779f0);
  if ((((short)(*(short *)&this_00->field_0x188 << 5) >> 0xe == -1) ||
      (bVar2 != ((short)(*(short *)&this_00->field_0x188 << 5) >> 0xe != 0))) &&
     ((sVar1 = *(short *)&this_00->field_0x188,
      *(ushort *)&this_00->field_0x188 =
           *(ushort *)&this_00->field_0x188 & 63999 | (ushort)bVar2 << 9,
      (short)(sVar1 << 5) >> 0xe != -1 ||
      (bVar3 = QCoreApplication::testAttribute(AA_DontShowIconsInMenus),
      bVar2 == (bool)((bVar3 ^ 0xff) & 1))))) {
    QActionPrivate::sendDataChanged(this_00);
  }
  return;
}

Assistant:

void QAction::setIconVisibleInMenu(bool visible)
{
    Q_D(QAction);
    if (d->iconVisibleInMenu == -1 || visible != bool(d->iconVisibleInMenu)) {
        int oldValue = d->iconVisibleInMenu;
        d->iconVisibleInMenu = visible;
        // Only send data changed if we really need to.
        if (oldValue != -1
            || visible == !QCoreApplication::testAttribute(Qt::AA_DontShowIconsInMenus)) {
            d->sendDataChanged();
        }
    }
}